

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Reader.cpp
# Opt level: O0

bool __thiscall
adios2::core::engine::BP5Reader::ReadActiveFlag
          (BP5Reader *this,vector<char,_std::allocator<char>_> *buffer)

{
  uchar uVar1;
  size_type sVar2;
  vector<char,_std::allocator<char>_> *in_RSI;
  long in_RDI;
  char activeChar;
  size_t position;
  allocator *in_stack_ffffffffffffff08;
  allocator *in_stack_ffffffffffffff10;
  allocator local_b9;
  string local_b8 [12];
  int in_stack_ffffffffffffff54;
  string *in_stack_ffffffffffffff58;
  string *in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff70;
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [48];
  
  sVar2 = std::vector<char,_std::allocator<char>_>::size(in_RSI);
  if (sVar2 < 0x27) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"Engine",&local_31);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"BP5Reader",&local_69);
    in_stack_ffffffffffffff10 = (allocator *)&stack0xffffffffffffff6f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff70,"ReadActiveFlag",in_stack_ffffffffffffff10);
    in_stack_ffffffffffffff08 = &local_b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_b8,"called with a buffer smaller than required",in_stack_ffffffffffffff08);
    helper::Throw<std::runtime_error>
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff6f);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  uVar1 = helper::ReadValue<unsigned_char>
                    ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff10,
                     (size_t *)in_stack_ffffffffffffff08,false);
  *(byte *)(in_RDI + 0x468) = -(uVar1 == '\x01') & 1;
  return (bool)(*(byte *)(in_RDI + 0x468) & 1);
}

Assistant:

bool BP5Reader::ReadActiveFlag(std::vector<char> &buffer)
{
    if (buffer.size() < m_ActiveFlagPosition)
    {
        helper::Throw<std::runtime_error>("Engine", "BP5Reader", "ReadActiveFlag",
                                          "called with a buffer smaller than required");
    }
    // Writer active flag
    size_t position = m_ActiveFlagPosition;
    const char activeChar =
        helper::ReadValue<uint8_t>(buffer, position, m_Minifooter.IsLittleEndian);
    m_WriterIsActive = (activeChar == '\1' ? true : false);
    return m_WriterIsActive;
}